

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void __thiscall kratos::GeneratorVarVisitor::visit(GeneratorVarVisitor *this,Generator *generator)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  long lVar1;
  InternalException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar2 [8];
  string_view format_str;
  format_args args;
  undefined1 local_a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vars;
  undefined1 local_70 [32];
  size_type sStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  Generator::get_all_var_names_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a8,generator);
  if (local_a8 !=
      (undefined1  [8])
      vars.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_70._16_8_ = &this->names_;
    __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_70 + 0x18);
    auVar2 = local_a8;
    do {
      Generator::get_var((Generator *)local_70,(string *)generator);
      if ((_func_int **)local_70._0_8_ == (_func_int **)0x0) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        local_70._24_8_ = (((pointer)auVar2)->_M_dataplus)._M_p;
        sStack_50 = ((pointer)auVar2)->_M_string_length;
        local_48._M_allocated_capacity = (size_type)(generator->name)._M_dataplus._M_p;
        local_48._8_8_ = (generator->name)._M_string_length;
        format_str.size_ = 0xdd;
        format_str.data_ = (char *)0x17;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)(local_70 + 0x18);
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)
                   &vars.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (detail *)"Cannot get {0} from {1}",format_str,args);
        InternalException::InternalException
                  (this_00,(string *)
                           &vars.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar1 = (**(code **)(*(_func_int **)local_70._0_8_ + 0x80))();
      if (this->registers_only_ == true) {
        if ((*(long *)(lVar1 + 0x18) != 0) &&
           (*(int *)(*(long *)(*(long *)(lVar1 + 0x10) + 8) + 0xd0) == 1)) {
          (**(code **)(*(_func_int **)local_70._0_8_ + 0x100))(__args);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     local_70._16_8_,__args);
          goto LAB_0021edb8;
        }
      }
      else {
        (**(code **)(*(_func_int **)local_70._0_8_ + 0x100))(__args);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   local_70._16_8_,__args);
LAB_0021edb8:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._24_8_ != &local_48) {
          operator_delete((void *)local_70._24_8_,(ulong)(local_48._M_allocated_capacity + 1));
        }
      }
      if ((pointer)local_70._8_8_ != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
      }
      auVar2 = (undefined1  [8])((long)auVar2 + 0x20);
    } while (auVar2 != (undefined1  [8])
                       vars.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a8);
  return;
}

Assistant:

void visit(Generator* generator) override {
        auto vars = generator->get_all_var_names();
        for (auto const& var_name : vars) {
            auto const& var = generator->get_var(var_name);
            if (!var)
                throw InternalException(
                    ::format("Cannot get {0} from {1}", var_name, generator->name));
            // detect if it has any non-blocking assignment
            auto const& sources = var->sources();
            if (registers_only_) {
                if (sources.empty()) continue;
                auto const& stmt = *(sources.begin());
                // only if a variable has non-blocking assignment
                // we assume that at this state we have already have all the assignment checked and
                // fixed
                if (stmt->assign_type() == AssignmentType::NonBlocking)
                    names_.emplace_back(var->handle_name());
            } else {
                names_.emplace_back(var->handle_name());
            }
        }
    }